

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  byte bVar1;
  uint32_t uVar2;
  Message **ppMVar3;
  MessageLite *pMVar4;
  Nonnull<const_char_*> pcVar5;
  bool bVar6;
  char *description;
  OneofDescriptor *pOVar7;
  Arena *pAVar8;
  Descriptor *pDVar9;
  Metadata MVar10;
  
  MVar10 = Message::GetMetadata(message);
  if (MVar10.reflection != this) {
    pDVar9 = this->descriptor_;
    MVar10 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar9,MVar10.descriptor,field,"MutableMessage");
  }
  pDVar9 = this->descriptor_;
  if (field->containing_type_ == pDVar9) {
    bVar1 = field->field_0x1;
    bVar6 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar6) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar6,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
        }
        if ((field->field_0x1 & 8) != 0) {
          if (factory == (MessageFactory *)0x0) {
            factory = this->message_factory_;
          }
          uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          pMVar4 = internal::ExtensionSet::MutableMessage
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2)
                              ,field,factory);
          return (Message *)pMVar4;
        }
        VerifyFieldType<google::protobuf::Message*>(this,field);
        ppMVar3 = (Message **)MutableRawImpl(this,message,field);
        bVar6 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
        if (bVar6) {
          if ((field->field_0x1 & 0x10) == 0) {
            pOVar7 = (OneofDescriptor *)0x0;
          }
          else {
            pOVar7 = (field->scope_).containing_oneof;
            if (pOVar7 == (OneofDescriptor *)0x0) goto LAB_002a69d2;
          }
          uVar2 = GetOneofCase(this,message,pOVar7);
          if (uVar2 != field->number_) {
            if ((field->field_0x1 & 0x10) == 0) {
              pOVar7 = (OneofDescriptor *)0x0;
            }
            else {
              pOVar7 = (field->scope_).containing_oneof;
              if (pOVar7 == (OneofDescriptor *)0x0) {
LAB_002a69d2:
                internal::protobuf_assumption_failed
                          ("res != nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb31);
              }
            }
            ClearOneof(this,message,pOVar7);
            ppMVar3 = MutableField<google::protobuf::Message*>(this,message,field);
            pMVar4 = &GetDefaultMessageInstance(this,field)->super_MessageLite;
            pAVar8 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pAVar8 & 1) != 0) {
              pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
            }
            pMVar4 = MessageLite::New(pMVar4,pAVar8);
            *ppMVar3 = (Message *)pMVar4;
          }
        }
        else {
          SetHasBit(this,message,field);
        }
        if (*ppMVar3 == (Message *)0x0) {
          pMVar4 = &GetDefaultMessageInstance(this,field)->super_MessageLite;
          pAVar8 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
          }
          pMVar4 = MessageLite::New(pMVar4,pAVar8);
          *ppMVar3 = (Message *)pMVar4;
        }
        return *ppMVar3;
      }
    }
    else {
      MutableMessage();
    }
    pDVar9 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar9,field,"MutableMessage",description);
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = GetDefaultMessageInstance(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetHasBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = GetDefaultMessageInstance(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}